

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
inf_or_nan_writer::operator()(inf_or_nan_writer *this,wchar_t **it)

{
  inf_or_nan_writer iVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  
  iVar1 = *this;
  pwVar2 = *it;
  pwVar3 = pwVar2;
  if (iVar1 != (inf_or_nan_writer)0x0) {
    pwVar3 = pwVar2 + 1;
    *it = pwVar3;
    *pwVar2 = (int)(char)iVar1;
  }
  pwVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char_const*,wchar_t*>(*(char **)(this + 8),*(char **)(this + 8) + 3,pwVar3);
  *it = pwVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (sign)
        *it++ = static_cast<char_type>(sign);
      it = internal::copy_str<char_type>(
            str, str + static_cast<std::size_t>(INF_SIZE), it);
    }